

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void linenoiseAtExit(void)

{
  char **__ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (ls.rawmode != 0) {
    iVar1 = tcsetattr(0,2,(termios *)&orig_termios);
    if (iVar1 != -1) {
      ls.rawmode = 0;
    }
  }
  __ptr = history;
  if (history != (char **)0x0) {
    lVar2 = (long)history_len;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        free(__ptr[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static void linenoiseAtExit(void) {
    linenoiseDisableRawMode(STDIN_FILENO);
    freeHistory();
}